

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O1

void __thiscall Apt::SortTaxiEdges(Apt *this)

{
  pointer puVar1;
  iterator __position;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  long lVar2;
  ulong uVar3;
  pointer pTVar4;
  unsigned_long local_28;
  
  puVar1 = (this->vecTaxiEdgesIdxHead).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vecTaxiEdgesIdxHead).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->vecTaxiEdgesIdxHead).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->vecTaxiEdgesIdxHead,
             ((long)(this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  local_28 = 0;
  pTVar4 = (this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar4) {
    do {
      if (pTVar4[local_28].type - RUN_WAY < 2) {
        __position._M_current =
             (this->vecTaxiEdgesIdxHead).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->vecTaxiEdgesIdxHead).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &this->vecTaxiEdgesIdxHead,__position,&local_28);
        }
        else {
          *__position._M_current = local_28;
          (this->vecTaxiEdgesIdxHead).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      local_28 = local_28 + 1;
      pTVar4 = (this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (local_28 <
             (ulong)(((long)(this->vecTaxiEdges).
                            super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pTVar4 >> 3) *
                    -0x3333333333333333));
  }
  __first._M_current =
       (this->vecTaxiEdgesIdxHead).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->vecTaxiEdgesIdxHead).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar3 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Apt::SortTaxiEdges()::_lambda(unsigned_long,unsigned_long)_1_>>
              (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_LTApt_cpp:627:19)>
                )this);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Apt::SortTaxiEdges()::_lambda(unsigned_long,unsigned_long)_1_>>
              (__first,__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_LTApt_cpp:627:19)>
                )this);
  }
  return;
}

Assistant:

void SortTaxiEdges ()
    {
        // We add all valid(!) edges to the sort array
        vecTaxiEdgesIdxHead.clear();
        vecTaxiEdgesIdxHead.reserve(vecTaxiEdges.size());
        for (size_t eIdx = 0; eIdx < vecTaxiEdges.size(); ++eIdx)
            if (vecTaxiEdges[eIdx].isValid())
                vecTaxiEdgesIdxHead.push_back(eIdx);
        
        // Now sort the index array by the angle of the linked edge
        std::sort(vecTaxiEdgesIdxHead.begin(),
                  vecTaxiEdgesIdxHead.end(),
                  [&](size_t a, size_t b)
                  { return vecTaxiEdges[a].angle < vecTaxiEdges[b].angle; });
    }